

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O3

void __thiscall
qclab::qgates::QRotationGate1<double>::QRotationGate1
          (QRotationGate1<double> *this,int qubit,real_type theta,bool fixed)

{
  double dVar1;
  
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0013a0a0;
  (this->super_QGate1<double>).qubit_ = qubit;
  if (-1 < qubit) {
    (this->super_QGate1<double>).field_0xc = fixed;
    (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_0013a770;
    dVar1 = ::cos(theta * 0.5);
    (this->rotation_).angle_.cos_ = dVar1;
    dVar1 = ::sin(theta * 0.5);
    (this->rotation_).angle_.sin_ = dVar1;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/qgates/QGate1.hpp"
                ,0x21,"qclab::qgates::QGate1<double>::QGate1(const int) [T = double]");
}

Assistant:

QRotationGate1()
        : QGate1< T >( 0 )
        , rotation_()
        , QAdjustable()
        { }